

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O2

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectLowerSet<true>
          (MultiIndexSet *__return_storage_ptr__,ProperWeights *weights,
          function<int_(int)> *rule_exactness,int normalized_offset,
          vector<int,_std::allocator<int>_> *level_limits)

{
  double dVar1;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> *this;
  int offset;
  size_t num_dimensions;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  cache;
  double noff;
  double local_140;
  int local_134;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_130;
  double local_118;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_110;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_f0;
  function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> local_d0;
  undefined1 local_b0 [64];
  anon_class_32_4_3c4e16dd local_70;
  _Function_base local_50;
  
  offset = (int)level_limits;
  local_140 = (double)((long)(weights->linear).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(weights->linear).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2);
  local_134 = normalized_offset;
  local_70.level_limits = level_limits;
  if (weights->contour == type_curved) {
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)(local_b0 + 0x20),(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)2,false>
              (&local_130,(MultiIndexManipulations *)weights,(ProperWeights *)(local_b0 + 0x20),
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    ::std::_Function_base::~_Function_base((_Function_base *)(local_b0 + 0x20));
    dVar1 = local_140;
    local_118 = (double)normalized_offset;
    local_70.noff = &local_118;
    local_70.num_dimensions = (size_t *)&local_140;
    local_70.cache = &local_130;
    ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
    function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_2_,void>
              ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_f0,&local_70);
    generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)dVar1,&local_f0);
    this = &local_f0;
  }
  else {
    if (weights->contour == type_level) {
      ::std::function<int_(int)>::function
                ((function<int_(int)> *)&local_50,(function<int_(int)> *)rule_exactness);
      generateLevelWeightsCache<int,(TasGrid::TypeDepth)1,false>
                ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&local_130,(MultiIndexManipulations *)weights,(ProperWeights *)&local_50,
                 (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
      ::std::_Function_base::~_Function_base(&local_50);
      dVar1 = local_140;
      local_70.num_dimensions = (size_t *)&local_140;
      local_70.noff = (double *)&local_134;
      local_70.cache = &local_130;
      ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
      function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_1_,void>
                ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_d0,
                 (anon_class_32_4_84b70047 *)&local_70);
      generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)dVar1,&local_d0);
      ::std::_Function_base::~_Function_base(&local_d0.super__Function_base);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_130);
      return __return_storage_ptr__;
    }
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)local_b0,(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)3,false>
              (&local_130,(MultiIndexManipulations *)weights,(ProperWeights *)local_b0,
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    ::std::_Function_base::~_Function_base((_Function_base *)local_b0);
    dVar1 = local_140;
    local_118 = (double)normalized_offset;
    local_70.noff = &local_118;
    local_70.num_dimensions = (size_t *)&local_140;
    local_70.cache = &local_130;
    ::std::function<bool(std::vector<int,std::allocator<int>>const&)>::
    function<TasGrid::MultiIndexManipulations::selectLowerSet<true>(TasGrid::MultiIndexManipulations::ProperWeights_const&,std::function<int(int)>,int,std::vector<int,std::allocator<int>>const&)::_lambda(std::vector<int,std::allocator<int>>const&)_3_,void>
              ((function<bool(std::vector<int,std::allocator<int>>const&)> *)&local_110,&local_70);
    generateLowerMultiIndexSet(__return_storage_ptr__,(size_t)dVar1,&local_110);
    this = &local_110;
  }
  ::std::_Function_base::~_Function_base(&this->super__Function_base);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet selectLowerSet(ProperWeights const &weights, std::function<int(int i)> rule_exactness,
                             int normalized_offset, std::vector<int> const &level_limits){
    size_t num_dimensions = weights.getNumDimensions();
    if (weights.contour == type_level){
        auto cache = generateLevelWeightsCache<int, type_level, false>(weights, rule_exactness, normalized_offset);
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (getIndexWeight<int, type_level>(index.data(), cache) <= normalized_offset);
                });
    }else if (weights.contour == type_curved){
        auto cache = generateLevelWeightsCache<double, type_curved, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_curved>(index.data(), cache)) <= noff);
                });
    }else{ // type_hyperbolic
        auto cache = generateLevelWeightsCache<double, type_hyperbolic, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_hyperbolic>(index.data(), cache)) <= noff);
                });
    }
}